

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  byte bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong *puVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  Geometry *pGVar31;
  float fVar69;
  undefined1 auVar39 [16];
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  float fVar38;
  undefined1 auVar40 [16];
  float fVar67;
  float fVar68;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar84;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [564];
  undefined1 local_1689;
  ulong *local_1688;
  size_t local_1680;
  RayK<4> *local_1678;
  ulong local_1670;
  Geometry *local_1668;
  ulong local_1660;
  uint local_1654;
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  undefined1 local_1630 [16];
  long local_1618;
  long local_1610;
  ulong local_1608;
  ulong local_1600;
  long local_15f8;
  ulong *local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  ulong local_15c8;
  ulong local_15c0;
  ulong local_15b8;
  RTCFilterFunctionNArguments local_15b0;
  undefined1 local_1580 [32];
  undefined1 local_1550 [16];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  float local_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float local_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined4 local_1440;
  undefined4 uStack_143c;
  undefined4 uStack_1438;
  undefined4 uStack_1434;
  undefined4 local_1430;
  undefined4 uStack_142c;
  undefined4 uStack_1428;
  undefined4 uStack_1424;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined1 local_1410 [16];
  uint local_1400;
  uint uStack_13fc;
  uint uStack_13f8;
  uint uStack_13f4;
  uint uStack_13f0;
  uint uStack_13ec;
  uint uStack_13e8;
  uint uStack_13e4;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 *local_12e0;
  char local_12d8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  uint uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  uint uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar107 = ZEXT3264(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar108 = ZEXT3264(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar109 = ZEXT3264(auVar41);
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar38 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar67 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar80 * 0.99999964)));
  auVar110 = ZEXT3264(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar38 * 0.99999964)));
  auVar111 = ZEXT3264(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar67 * 0.99999964)));
  auVar112 = ZEXT3264(auVar41);
  fVar80 = fVar80 * 1.0000004;
  fVar38 = fVar38 * 1.0000004;
  fVar67 = fVar67 * 1.0000004;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar35 = uVar32 ^ 0x20;
  uVar37 = uVar33 ^ 0x20;
  iVar1 = (tray->tnear).field_0.i[k];
  local_13c0._4_4_ = iVar1;
  local_13c0._0_4_ = iVar1;
  local_13c0._8_4_ = iVar1;
  local_13c0._12_4_ = iVar1;
  local_13c0._16_4_ = iVar1;
  local_13c0._20_4_ = iVar1;
  local_13c0._24_4_ = iVar1;
  local_13c0._28_4_ = iVar1;
  auVar100 = ZEXT3264(local_13c0);
  iVar1 = (tray->tfar).field_0.i[k];
  local_13e0._4_4_ = iVar1;
  local_13e0._0_4_ = iVar1;
  local_13e0._8_4_ = iVar1;
  local_13e0._12_4_ = iVar1;
  local_13e0._16_4_ = iVar1;
  local_13e0._20_4_ = iVar1;
  local_13e0._24_4_ = iVar1;
  local_13e0._28_4_ = iVar1;
  auVar103 = ZEXT3264(local_13e0);
  local_15c0 = uVar32 >> 2;
  local_15c8 = uVar35 >> 2;
  local_15d0 = uVar33 >> 2;
  local_15d8 = uVar37 >> 2;
  local_15e0 = uVar26 >> 2;
  local_15e8 = (uVar26 ^ 0x20) >> 2;
  local_1550 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  puVar23 = local_11f8;
  fVar68 = fVar80;
  fVar69 = fVar80;
  fVar70 = fVar80;
  fVar71 = fVar80;
  fVar72 = fVar80;
  fVar84 = fVar80;
  fVar87 = fVar38;
  fVar88 = fVar38;
  fVar89 = fVar38;
  fVar90 = fVar38;
  fVar91 = fVar38;
  fVar92 = fVar38;
  fVar93 = fVar67;
  fVar94 = fVar67;
  fVar95 = fVar67;
  fVar96 = fVar67;
  fVar97 = fVar67;
  fVar98 = fVar67;
  local_1680 = k;
  local_1678 = ray;
  local_1608 = uVar33;
  local_1600 = uVar32;
  local_13a0 = fVar67;
  fStack_139c = fVar67;
  fStack_1398 = fVar67;
  fStack_1394 = fVar67;
  fStack_1390 = fVar67;
  fStack_138c = fVar67;
  fStack_1388 = fVar67;
  fStack_1384 = fVar67;
  local_1380 = fVar38;
  fStack_137c = fVar38;
  fStack_1378 = fVar38;
  fStack_1374 = fVar38;
  fStack_1370 = fVar38;
  fStack_136c = fVar38;
  fStack_1368 = fVar38;
  fStack_1364 = fVar38;
  local_1360 = fVar80;
  fStack_135c = fVar80;
  fStack_1358 = fVar80;
  fStack_1354 = fVar80;
  fStack_1350 = fVar80;
  fStack_134c = fVar80;
  fStack_1348 = fVar80;
  fStack_1344 = fVar80;
LAB_01dd0082:
  do {
    local_15f0 = puVar23;
    if (local_15f0 == &local_1200) {
LAB_01dd0d26:
      return local_15f0 != &local_1200;
    }
    local_1688 = local_15f0 + -1;
    uVar36 = local_15f0[-1];
    while ((uVar36 & 8) == 0) {
      auVar41 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar32),auVar107._0_32_);
      auVar41 = vmulps_avx512vl(auVar110._0_32_,auVar41);
      auVar42 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar33),auVar108._0_32_);
      auVar42 = vmulps_avx512vl(auVar111._0_32_,auVar42);
      auVar41 = vmaxps_avx(auVar41,auVar42);
      auVar42 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar26),auVar109._0_32_);
      auVar43 = vmulps_avx512vl(auVar112._0_32_,auVar42);
      auVar44 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar35),auVar107._0_32_);
      auVar42._4_4_ = fVar68 * auVar44._4_4_;
      auVar42._0_4_ = fVar80 * auVar44._0_4_;
      auVar42._8_4_ = fVar69 * auVar44._8_4_;
      auVar42._12_4_ = fVar70 * auVar44._12_4_;
      auVar42._16_4_ = fVar71 * auVar44._16_4_;
      auVar42._20_4_ = fVar72 * auVar44._20_4_;
      auVar42._24_4_ = fVar84 * auVar44._24_4_;
      auVar42._28_4_ = auVar44._28_4_;
      auVar45 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar37),auVar108._0_32_);
      auVar44._4_4_ = fVar87 * auVar45._4_4_;
      auVar44._0_4_ = fVar38 * auVar45._0_4_;
      auVar44._8_4_ = fVar88 * auVar45._8_4_;
      auVar44._12_4_ = fVar89 * auVar45._12_4_;
      auVar44._16_4_ = fVar90 * auVar45._16_4_;
      auVar44._20_4_ = fVar91 * auVar45._20_4_;
      auVar44._24_4_ = fVar92 * auVar45._24_4_;
      auVar44._28_4_ = auVar45._28_4_;
      auVar44 = vminps_avx(auVar42,auVar44);
      auVar42 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar26 ^ 0x20)),
                                auVar109._0_32_);
      auVar45._4_4_ = fVar93 * auVar42._4_4_;
      auVar45._0_4_ = fVar67 * auVar42._0_4_;
      auVar45._8_4_ = fVar94 * auVar42._8_4_;
      auVar45._12_4_ = fVar95 * auVar42._12_4_;
      auVar45._16_4_ = fVar96 * auVar42._16_4_;
      auVar45._20_4_ = fVar97 * auVar42._20_4_;
      auVar45._24_4_ = fVar98 * auVar42._24_4_;
      auVar45._28_4_ = auVar42._28_4_;
      auVar42 = vmaxps_avx(auVar43,auVar100._0_32_);
      auVar41 = vmaxps_avx(auVar41,auVar42);
      auVar42 = vminps_avx(auVar45,auVar103._0_32_);
      auVar42 = vminps_avx(auVar44,auVar42);
      uVar29 = vcmpps_avx512vl(auVar41,auVar42,2);
      puVar23 = local_1688;
      if ((char)uVar29 == '\0') goto LAB_01dd0082;
      uVar24 = uVar36 & 0xfffffffffffffff0;
      lVar25 = 0;
      for (uVar36 = uVar29; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar36 = *(ulong *)(uVar24 + lVar25 * 8);
      uVar28 = (uint)uVar29 - 1 & (uint)uVar29;
      uVar29 = (ulong)uVar28;
      if (uVar28 != 0) {
        do {
          *local_1688 = uVar36;
          local_1688 = local_1688 + 1;
          lVar25 = 0;
          for (uVar36 = uVar29; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar29 = uVar29 - 1 & uVar29;
          uVar36 = *(ulong *)(uVar24 + lVar25 * 8);
        } while (uVar29 != 0);
      }
    }
    local_1618 = (ulong)((uint)uVar36 & 0xf) - 8;
    uVar36 = uVar36 & 0xfffffffffffffff0;
    for (local_1610 = 0; puVar23 = local_1688, local_1610 != local_1618; local_1610 = local_1610 + 1
        ) {
      lVar25 = local_1610 * 0x90;
      local_15f8 = uVar36 + lVar25;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = *(ulong *)(uVar36 + 0x40 + lVar25);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = *(ulong *)(uVar36 + 0x48 + lVar25);
      uVar16 = vpcmpub_avx512vl(auVar73,auVar75,2);
      uVar2 = *(undefined4 *)(uVar36 + 0x70 + lVar25);
      auVar48._4_4_ = uVar2;
      auVar48._0_4_ = uVar2;
      auVar48._8_4_ = uVar2;
      auVar48._12_4_ = uVar2;
      auVar48._16_4_ = uVar2;
      auVar48._20_4_ = uVar2;
      auVar48._24_4_ = uVar2;
      auVar48._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar36 + 0x7c + lVar25);
      auVar51._4_4_ = uVar2;
      auVar51._0_4_ = uVar2;
      auVar51._8_4_ = uVar2;
      auVar51._12_4_ = uVar2;
      auVar51._16_4_ = uVar2;
      auVar51._20_4_ = uVar2;
      auVar51._24_4_ = uVar2;
      auVar51._28_4_ = uVar2;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(local_15c0 + 0x40 + local_15f8);
      auVar41 = vpmovzxbd_avx2(auVar3);
      auVar41 = vcvtdq2ps_avx(auVar41);
      auVar3 = vfmadd213ps_fma(auVar41,auVar51,auVar48);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)(local_15c8 + 0x40 + local_15f8);
      auVar41 = vpmovzxbd_avx2(auVar39);
      auVar41 = vcvtdq2ps_avx(auVar41);
      auVar39 = vfmadd213ps_fma(auVar41,auVar51,auVar48);
      uVar2 = *(undefined4 *)(uVar36 + 0x74 + lVar25);
      auVar49._4_4_ = uVar2;
      auVar49._0_4_ = uVar2;
      auVar49._8_4_ = uVar2;
      auVar49._12_4_ = uVar2;
      auVar49._16_4_ = uVar2;
      auVar49._20_4_ = uVar2;
      auVar49._24_4_ = uVar2;
      auVar49._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar36 + 0x80 + lVar25);
      auVar52._4_4_ = uVar2;
      auVar52._0_4_ = uVar2;
      auVar52._8_4_ = uVar2;
      auVar52._12_4_ = uVar2;
      auVar52._16_4_ = uVar2;
      auVar52._20_4_ = uVar2;
      auVar52._24_4_ = uVar2;
      auVar52._28_4_ = uVar2;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(local_15d0 + 0x40 + local_15f8);
      auVar41 = vpmovzxbd_avx2(auVar4);
      auVar41 = vcvtdq2ps_avx(auVar41);
      auVar4 = vfmadd213ps_fma(auVar41,auVar52,auVar49);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(local_15d8 + 0x40 + local_15f8);
      auVar41 = vpmovzxbd_avx2(auVar5);
      auVar41 = vcvtdq2ps_avx(auVar41);
      auVar5 = vfmadd213ps_fma(auVar41,auVar52,auVar49);
      uVar2 = *(undefined4 *)(uVar36 + 0x78 + lVar25);
      auVar50._4_4_ = uVar2;
      auVar50._0_4_ = uVar2;
      auVar50._8_4_ = uVar2;
      auVar50._12_4_ = uVar2;
      auVar50._16_4_ = uVar2;
      auVar50._20_4_ = uVar2;
      auVar50._24_4_ = uVar2;
      auVar50._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar36 + 0x84 + lVar25);
      auVar53._4_4_ = uVar2;
      auVar53._0_4_ = uVar2;
      auVar53._8_4_ = uVar2;
      auVar53._12_4_ = uVar2;
      auVar53._16_4_ = uVar2;
      auVar53._20_4_ = uVar2;
      auVar53._24_4_ = uVar2;
      auVar53._28_4_ = uVar2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(local_15e0 + 0x40 + local_15f8);
      auVar41 = vpmovzxbd_avx2(auVar6);
      auVar41 = vcvtdq2ps_avx(auVar41);
      auVar6 = vfmadd213ps_fma(auVar41,auVar53,auVar50);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(local_15e8 + 0x40 + local_15f8);
      auVar41 = vpmovzxbd_avx2(auVar7);
      auVar41 = vcvtdq2ps_avx(auVar41);
      auVar7 = vfmadd213ps_fma(auVar41,auVar53,auVar50);
      auVar41 = vsubps_avx512vl(ZEXT1632(auVar3),auVar107._0_32_);
      auVar41 = vmulps_avx512vl(auVar110._0_32_,auVar41);
      auVar42 = vsubps_avx512vl(ZEXT1632(auVar4),auVar108._0_32_);
      auVar42 = vmulps_avx512vl(auVar111._0_32_,auVar42);
      auVar41 = vmaxps_avx(auVar41,auVar42);
      auVar42 = vsubps_avx512vl(ZEXT1632(auVar6),auVar109._0_32_);
      auVar42 = vmulps_avx512vl(auVar112._0_32_,auVar42);
      auVar44 = vsubps_avx512vl(ZEXT1632(auVar39),auVar107._0_32_);
      auVar43._4_4_ = fVar68 * auVar44._4_4_;
      auVar43._0_4_ = fVar80 * auVar44._0_4_;
      auVar43._8_4_ = fVar69 * auVar44._8_4_;
      auVar43._12_4_ = fVar70 * auVar44._12_4_;
      auVar43._16_4_ = fVar71 * auVar44._16_4_;
      auVar43._20_4_ = fVar72 * auVar44._20_4_;
      auVar43._24_4_ = fVar84 * auVar44._24_4_;
      auVar43._28_4_ = auVar44._28_4_;
      auVar44 = vsubps_avx512vl(ZEXT1632(auVar5),auVar108._0_32_);
      auVar46._4_4_ = fVar87 * auVar44._4_4_;
      auVar46._0_4_ = fVar38 * auVar44._0_4_;
      auVar46._8_4_ = fVar88 * auVar44._8_4_;
      auVar46._12_4_ = fVar89 * auVar44._12_4_;
      auVar46._16_4_ = fVar90 * auVar44._16_4_;
      auVar46._20_4_ = fVar91 * auVar44._20_4_;
      auVar46._24_4_ = fVar92 * auVar44._24_4_;
      auVar46._28_4_ = auVar44._28_4_;
      auVar44 = vminps_avx(auVar43,auVar46);
      auVar45 = vsubps_avx512vl(ZEXT1632(auVar7),auVar109._0_32_);
      auVar47._4_4_ = fVar93 * auVar45._4_4_;
      auVar47._0_4_ = fVar67 * auVar45._0_4_;
      auVar47._8_4_ = fVar94 * auVar45._8_4_;
      auVar47._12_4_ = fVar95 * auVar45._12_4_;
      auVar47._16_4_ = fVar96 * auVar45._16_4_;
      auVar47._20_4_ = fVar97 * auVar45._20_4_;
      auVar47._24_4_ = fVar98 * auVar45._24_4_;
      auVar47._28_4_ = auVar45._28_4_;
      auVar42 = vmaxps_avx(auVar42,auVar100._0_32_);
      auVar41 = vmaxps_avx(auVar41,auVar42);
      auVar42 = vminps_avx(auVar47,auVar103._0_32_);
      auVar42 = vminps_avx(auVar44,auVar42);
      uVar15 = vcmpps_avx512vl(auVar41,auVar42,2);
      for (local_15b8 = CONCAT44((int)(local_15e8 >> 0x20),(uint)(byte)((byte)uVar16 & (byte)uVar15)
                                ); local_15b8 != 0; local_15b8 = local_15b8 - 1 & local_15b8) {
        lVar25 = 0;
        for (uVar32 = local_15b8; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar8 = *(ushort *)(local_15f8 + lVar25 * 8);
        uVar9 = *(ushort *)(local_15f8 + 2 + lVar25 * 8);
        pGVar31 = (context->scene->geometries).items[*(uint *)(local_15f8 + 0x88)].ptr;
        lVar10 = *(long *)&pGVar31->field_0x58;
        lVar34 = pGVar31[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (ulong)*(uint *)(local_15f8 + 4 + lVar25 * 8);
        local_1654 = uVar9 & 0x7fff;
        uVar28 = *(uint *)(lVar10 + 4 + lVar34);
        uVar29 = (ulong)uVar28;
        uVar33 = (ulong)(uVar28 * local_1654 + *(int *)(lVar10 + lVar34) + (uVar8 & 0x7fff));
        lVar25 = *(long *)&pGVar31[1].time_range.upper;
        p_Var11 = pGVar31[1].intersectionFilterN;
        auVar3 = *(undefined1 (*) [16])(lVar25 + (uVar33 + 1) * (long)p_Var11);
        auVar39 = *(undefined1 (*) [16])(lVar25 + (uVar33 + uVar29) * (long)p_Var11);
        lVar27 = uVar33 + uVar29 + 1;
        auVar4 = *(undefined1 (*) [16])(lVar25 + lVar27 * (long)p_Var11);
        uVar32 = (ulong)(-1 < (short)uVar8);
        auVar5 = *(undefined1 (*) [16])(lVar25 + (uVar33 + uVar32 + 1) * (long)p_Var11);
        lVar30 = uVar32 + lVar27;
        auVar6 = *(undefined1 (*) [16])(lVar25 + lVar30 * (long)p_Var11);
        uVar32 = 0;
        if (-1 < (short)uVar9) {
          uVar32 = uVar29;
        }
        auVar7 = *(undefined1 (*) [16])(lVar25 + (uVar33 + uVar29 + uVar32) * (long)p_Var11);
        auVar73 = *(undefined1 (*) [16])(lVar25 + (lVar27 + uVar32) * (long)p_Var11);
        auVar81._16_16_ = *(undefined1 (*) [16])(lVar25 + (uVar32 + lVar30) * (long)p_Var11);
        auVar81._0_16_ = auVar4;
        auVar13 = vunpcklps_avx(auVar3,auVar6);
        auVar75 = vunpckhps_avx(auVar3,auVar6);
        auVar76 = vunpcklps_avx(auVar5,auVar4);
        auVar5 = vunpckhps_avx(auVar5,auVar4);
        auVar79 = vunpcklps_avx(auVar75,auVar5);
        auVar40 = vunpcklps_avx(auVar13,auVar76);
        auVar5 = vunpckhps_avx(auVar13,auVar76);
        auVar13 = vunpcklps_avx(auVar39,auVar73);
        auVar75 = vunpckhps_avx(auVar39,auVar73);
        auVar76 = vunpcklps_avx(auVar4,auVar7);
        auVar7 = vunpckhps_avx(auVar4,auVar7);
        auVar75 = vunpcklps_avx(auVar75,auVar7);
        auVar14 = vunpcklps_avx(auVar13,auVar76);
        auVar7 = vunpckhps_avx(auVar13,auVar76);
        auVar57._16_16_ = auVar73;
        auVar57._0_16_ = auVar39;
        auVar55._16_16_ = auVar6;
        auVar55._0_16_ = auVar3;
        auVar41 = vunpcklps_avx(auVar55,auVar57);
        auVar54._16_16_ = auVar4;
        auVar54._0_16_ = *(undefined1 (*) [16])(lVar25 + (long)p_Var11 * uVar33);
        auVar42 = vunpcklps_avx(auVar54,auVar81);
        auVar45 = vunpcklps_avx(auVar42,auVar41);
        auVar42 = vunpckhps_avx(auVar42,auVar41);
        auVar41 = vunpckhps_avx(auVar55,auVar57);
        auVar44 = vunpckhps_avx(auVar54,auVar81);
        auVar44 = vunpcklps_avx(auVar44,auVar41);
        auVar56._16_16_ = auVar40;
        auVar56._0_16_ = auVar40;
        auVar58._16_16_ = auVar5;
        auVar58._0_16_ = auVar5;
        auVar64._16_16_ = auVar79;
        auVar64._0_16_ = auVar79;
        auVar82._16_16_ = auVar14;
        auVar82._0_16_ = auVar14;
        auVar104._16_16_ = auVar7;
        auVar104._0_16_ = auVar7;
        uVar2 = *(undefined4 *)(local_1678 + local_1680 * 4);
        auVar105._4_4_ = uVar2;
        auVar105._0_4_ = uVar2;
        auVar105._8_4_ = uVar2;
        auVar105._12_4_ = uVar2;
        auVar105._16_4_ = uVar2;
        auVar105._20_4_ = uVar2;
        auVar105._24_4_ = uVar2;
        auVar105._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(local_1678 + local_1680 * 4 + 0x10);
        auVar106._4_4_ = uVar2;
        auVar106._0_4_ = uVar2;
        auVar106._8_4_ = uVar2;
        auVar106._12_4_ = uVar2;
        auVar106._16_4_ = uVar2;
        auVar106._20_4_ = uVar2;
        auVar106._24_4_ = uVar2;
        auVar106._28_4_ = uVar2;
        auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_1678 + local_1680 * 4 + 0x20)));
        uVar2 = *(undefined4 *)(local_1678 + local_1680 * 4 + 0x40);
        auVar78._4_4_ = uVar2;
        auVar78._0_4_ = uVar2;
        auVar78._8_4_ = uVar2;
        auVar78._12_4_ = uVar2;
        auVar78._16_4_ = uVar2;
        auVar78._20_4_ = uVar2;
        auVar78._24_4_ = uVar2;
        auVar78._28_4_ = uVar2;
        auVar101._16_16_ = auVar75;
        auVar101._0_16_ = auVar75;
        uVar2 = *(undefined4 *)(local_1678 + local_1680 * 4 + 0x50);
        auVar85._4_4_ = uVar2;
        auVar85._0_4_ = uVar2;
        auVar85._8_4_ = uVar2;
        auVar85._12_4_ = uVar2;
        auVar85._16_4_ = uVar2;
        auVar85._20_4_ = uVar2;
        auVar85._24_4_ = uVar2;
        auVar85._28_4_ = uVar2;
        fVar80 = *(float *)(local_1678 + local_1680 * 4 + 0x60);
        auVar99._4_4_ = fVar80;
        auVar99._0_4_ = fVar80;
        auVar99._8_4_ = fVar80;
        auVar99._12_4_ = fVar80;
        auVar99._16_4_ = fVar80;
        auVar99._20_4_ = fVar80;
        auVar99._24_4_ = fVar80;
        auVar99._28_4_ = fVar80;
        auVar41 = vsubps_avx(auVar45,auVar105);
        auVar42 = vsubps_avx(auVar42,auVar106);
        auVar46 = vsubps_avx512vl(auVar44,auVar43);
        auVar44 = vsubps_avx(auVar56,auVar105);
        auVar45 = vsubps_avx(auVar58,auVar106);
        auVar47 = vsubps_avx512vl(auVar64,auVar43);
        auVar48 = vsubps_avx512vl(auVar82,auVar105);
        auVar49 = vsubps_avx512vl(auVar104,auVar106);
        auVar43 = vsubps_avx512vl(auVar101,auVar43);
        auVar50 = vsubps_avx512vl(auVar48,auVar41);
        auVar51 = vsubps_avx512vl(auVar49,auVar42);
        auVar52 = vsubps_avx512vl(auVar43,auVar46);
        auVar53 = vsubps_avx512vl(auVar41,auVar44);
        auVar54 = vsubps_avx512vl(auVar42,auVar45);
        auVar55 = vsubps_avx512vl(auVar46,auVar47);
        auVar56 = vsubps_avx512vl(auVar44,auVar48);
        auVar57 = vsubps_avx512vl(auVar45,auVar49);
        auVar58 = vsubps_avx512vl(auVar47,auVar43);
        auVar59 = vaddps_avx512vl(auVar48,auVar41);
        auVar60 = vaddps_avx512vl(auVar49,auVar42);
        auVar61 = vaddps_avx512vl(auVar43,auVar46);
        auVar62 = vmulps_avx512vl(auVar60,auVar52);
        auVar62 = vfmsub231ps_avx512vl(auVar62,auVar51,auVar61);
        auVar61 = vmulps_avx512vl(auVar61,auVar50);
        auVar63 = vfmsub231ps_avx512vl(auVar61,auVar52,auVar59);
        auVar61._4_4_ = auVar59._4_4_ * auVar51._4_4_;
        auVar61._0_4_ = auVar59._0_4_ * auVar51._0_4_;
        auVar61._8_4_ = auVar59._8_4_ * auVar51._8_4_;
        auVar61._12_4_ = auVar59._12_4_ * auVar51._12_4_;
        auVar61._16_4_ = auVar59._16_4_ * auVar51._16_4_;
        auVar61._20_4_ = auVar59._20_4_ * auVar51._20_4_;
        auVar61._24_4_ = auVar59._24_4_ * auVar51._24_4_;
        auVar61._28_4_ = auVar59._28_4_;
        auVar3 = vfmsub231ps_fma(auVar61,auVar50,auVar60);
        auVar83._0_4_ = auVar3._0_4_ * fVar80;
        auVar83._4_4_ = auVar3._4_4_ * fVar80;
        auVar83._8_4_ = auVar3._8_4_ * fVar80;
        auVar83._12_4_ = auVar3._12_4_ * fVar80;
        auVar83._16_4_ = fVar80 * 0.0;
        auVar83._20_4_ = fVar80 * 0.0;
        auVar83._24_4_ = fVar80 * 0.0;
        auVar83._28_4_ = 0;
        auVar59 = vfmadd231ps_avx512vl(auVar83,auVar85,auVar63);
        auVar61 = vfmadd231ps_avx512vl(auVar59,auVar78,auVar62);
        auVar102._0_4_ = auVar41._0_4_ + auVar44._0_4_;
        auVar102._4_4_ = auVar41._4_4_ + auVar44._4_4_;
        auVar102._8_4_ = auVar41._8_4_ + auVar44._8_4_;
        auVar102._12_4_ = auVar41._12_4_ + auVar44._12_4_;
        auVar102._16_4_ = auVar41._16_4_ + auVar44._16_4_;
        auVar102._20_4_ = auVar41._20_4_ + auVar44._20_4_;
        auVar102._24_4_ = auVar41._24_4_ + auVar44._24_4_;
        auVar102._28_4_ = auVar41._28_4_ + auVar44._28_4_;
        auVar59 = vaddps_avx512vl(auVar42,auVar45);
        auVar60 = vaddps_avx512vl(auVar46,auVar47);
        auVar62 = vmulps_avx512vl(auVar59,auVar55);
        auVar63 = vfmsub231ps_avx512vl(auVar62,auVar54,auVar60);
        auVar60 = vmulps_avx512vl(auVar60,auVar53);
        auVar60 = vfmsub231ps_avx512vl(auVar60,auVar55,auVar102);
        auVar62 = vmulps_avx512vl(auVar102,auVar54);
        auVar59 = vfmsub231ps_avx512vl(auVar62,auVar53,auVar59);
        auVar62._4_4_ = auVar59._4_4_ * fVar80;
        auVar62._0_4_ = auVar59._0_4_ * fVar80;
        auVar62._8_4_ = auVar59._8_4_ * fVar80;
        auVar62._12_4_ = auVar59._12_4_ * fVar80;
        auVar62._16_4_ = auVar59._16_4_ * fVar80;
        auVar62._20_4_ = auVar59._20_4_ * fVar80;
        auVar62._24_4_ = auVar59._24_4_ * fVar80;
        auVar62._28_4_ = auVar59._28_4_;
        auVar59 = vfmadd231ps_avx512vl(auVar62,auVar85,auVar60);
        auVar62 = vfmadd231ps_avx512vl(auVar59,auVar78,auVar63);
        auVar64 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar44 = vaddps_avx512vl(auVar44,auVar48);
        auVar45 = vaddps_avx512vl(auVar45,auVar49);
        auVar43 = vaddps_avx512vl(auVar47,auVar43);
        auVar47 = vmulps_avx512vl(auVar45,auVar58);
        auVar47 = vfmsub231ps_avx512vl(auVar47,auVar57,auVar43);
        auVar43 = vmulps_avx512vl(auVar43,auVar56);
        auVar43 = vfmsub231ps_avx512vl(auVar43,auVar58,auVar44);
        auVar63._4_4_ = auVar44._4_4_ * auVar57._4_4_;
        auVar63._0_4_ = auVar44._0_4_ * auVar57._0_4_;
        auVar63._8_4_ = auVar44._8_4_ * auVar57._8_4_;
        auVar63._12_4_ = auVar44._12_4_ * auVar57._12_4_;
        auVar63._16_4_ = auVar44._16_4_ * auVar57._16_4_;
        auVar63._20_4_ = auVar44._20_4_ * auVar57._20_4_;
        auVar63._24_4_ = auVar44._24_4_ * auVar57._24_4_;
        auVar63._28_4_ = auVar44._28_4_;
        auVar3 = vfmsub231ps_fma(auVar63,auVar56,auVar45);
        auVar44 = vmulps_avx512vl(ZEXT1632(auVar3),auVar99);
        auVar44 = vfmadd231ps_avx512vl(auVar44,auVar85,auVar43);
        auVar44 = vfmadd231ps_avx512vl(auVar44,auVar78,auVar47);
        auVar74._0_4_ = auVar61._0_4_ + auVar62._0_4_;
        auVar74._4_4_ = auVar61._4_4_ + auVar62._4_4_;
        auVar74._8_4_ = auVar61._8_4_ + auVar62._8_4_;
        auVar74._12_4_ = auVar61._12_4_ + auVar62._12_4_;
        auVar74._16_4_ = auVar61._16_4_ + auVar62._16_4_;
        auVar74._20_4_ = auVar61._20_4_ + auVar62._20_4_;
        auVar74._24_4_ = auVar61._24_4_ + auVar62._24_4_;
        auVar74._28_4_ = auVar61._28_4_ + auVar62._28_4_;
        local_1300 = vaddps_avx512vl(auVar44,auVar74);
        vandps_avx512vl(local_1300,auVar64);
        auVar59._8_4_ = 0x34000000;
        auVar59._0_8_ = 0x3400000034000000;
        auVar59._12_4_ = 0x34000000;
        auVar59._16_4_ = 0x34000000;
        auVar59._20_4_ = 0x34000000;
        auVar59._24_4_ = 0x34000000;
        auVar59._28_4_ = 0x34000000;
        auVar45 = vmulps_avx512vl(local_1300,auVar59);
        auVar43 = vminps_avx512vl(auVar61,auVar62);
        auVar43 = vminps_avx512vl(auVar43,auVar44);
        auVar60._8_4_ = 0x80000000;
        auVar60._0_8_ = 0x8000000080000000;
        auVar60._12_4_ = 0x80000000;
        auVar60._16_4_ = 0x80000000;
        auVar60._20_4_ = 0x80000000;
        auVar60._24_4_ = 0x80000000;
        auVar60._28_4_ = 0x80000000;
        auVar47 = vxorps_avx512vl(auVar45,auVar60);
        uVar15 = vcmpps_avx512vl(auVar43,auVar47,5);
        auVar43 = vmaxps_avx512vl(auVar61,auVar62);
        auVar44 = vmaxps_avx512vl(auVar43,auVar44);
        uVar16 = vcmpps_avx512vl(auVar44,auVar45,2);
        bVar17 = (byte)uVar15 | (byte)uVar16;
        if (bVar17 != 0) {
          auVar44 = vmulps_avx512vl(auVar54,auVar52);
          auVar45 = vmulps_avx512vl(auVar50,auVar55);
          auVar43 = vmulps_avx512vl(auVar53,auVar51);
          auVar47 = vmulps_avx512vl(auVar57,auVar55);
          auVar48 = vmulps_avx512vl(auVar53,auVar58);
          auVar49 = vmulps_avx512vl(auVar56,auVar54);
          auVar51 = vfmsub213ps_avx512vl(auVar51,auVar55,auVar44);
          auVar52 = vfmsub213ps_avx512vl(auVar52,auVar53,auVar45);
          auVar50 = vfmsub213ps_avx512vl(auVar50,auVar54,auVar43);
          auVar59 = vfmsub213ps_avx512vl(auVar58,auVar54,auVar47);
          auVar60 = vfmsub213ps_avx512vl(auVar56,auVar55,auVar48);
          auVar53 = vfmsub213ps_avx512vl(auVar57,auVar53,auVar49);
          vandps_avx512vl(auVar44,auVar64);
          vandps_avx512vl(auVar47,auVar64);
          uVar32 = vcmpps_avx512vl(auVar53,auVar53,1);
          vandps_avx512vl(auVar45,auVar64);
          vandps_avx512vl(auVar48,auVar64);
          uVar33 = vcmpps_avx512vl(auVar53,auVar53,1);
          vandps_avx512vl(auVar43,auVar64);
          vandps_avx512vl(auVar49,auVar64);
          uVar29 = vcmpps_avx512vl(auVar53,auVar53,1);
          bVar12 = (bool)((byte)uVar32 & 1);
          auVar65._0_4_ = (float)((uint)bVar12 * auVar51._0_4_ | (uint)!bVar12 * auVar59._0_4_);
          bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar65._4_4_ = (float)((uint)bVar12 * auVar51._4_4_ | (uint)!bVar12 * auVar59._4_4_);
          bVar12 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar65._8_4_ = (float)((uint)bVar12 * auVar51._8_4_ | (uint)!bVar12 * auVar59._8_4_);
          bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar65._12_4_ = (float)((uint)bVar12 * auVar51._12_4_ | (uint)!bVar12 * auVar59._12_4_);
          bVar12 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar65._16_4_ = (float)((uint)bVar12 * auVar51._16_4_ | (uint)!bVar12 * auVar59._16_4_);
          bVar12 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar65._20_4_ = (float)((uint)bVar12 * auVar51._20_4_ | (uint)!bVar12 * auVar59._20_4_);
          bVar12 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar65._24_4_ = (float)((uint)bVar12 * auVar51._24_4_ | (uint)!bVar12 * auVar59._24_4_);
          bVar12 = SUB81(uVar32 >> 7,0);
          auVar65._28_4_ = (uint)bVar12 * auVar51._28_4_ | (uint)!bVar12 * auVar59._28_4_;
          bVar12 = (bool)((byte)uVar33 & 1);
          auVar66._0_4_ = (float)((uint)bVar12 * auVar52._0_4_ | (uint)!bVar12 * auVar60._0_4_);
          bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
          auVar66._4_4_ = (float)((uint)bVar12 * auVar52._4_4_ | (uint)!bVar12 * auVar60._4_4_);
          bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
          auVar66._8_4_ = (float)((uint)bVar12 * auVar52._8_4_ | (uint)!bVar12 * auVar60._8_4_);
          bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
          auVar66._12_4_ = (float)((uint)bVar12 * auVar52._12_4_ | (uint)!bVar12 * auVar60._12_4_);
          bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
          auVar66._16_4_ = (float)((uint)bVar12 * auVar52._16_4_ | (uint)!bVar12 * auVar60._16_4_);
          bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
          auVar66._20_4_ = (float)((uint)bVar12 * auVar52._20_4_ | (uint)!bVar12 * auVar60._20_4_);
          bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
          auVar66._24_4_ = (float)((uint)bVar12 * auVar52._24_4_ | (uint)!bVar12 * auVar60._24_4_);
          bVar12 = SUB81(uVar33 >> 7,0);
          auVar66._28_4_ = (uint)bVar12 * auVar52._28_4_ | (uint)!bVar12 * auVar60._28_4_;
          bVar12 = (bool)((byte)uVar29 & 1);
          fVar38 = (float)((uint)bVar12 * auVar50._0_4_ | (uint)!bVar12 * auVar53._0_4_);
          bVar12 = (bool)((byte)(uVar29 >> 1) & 1);
          fVar67 = (float)((uint)bVar12 * auVar50._4_4_ | (uint)!bVar12 * auVar53._4_4_);
          bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
          fVar68 = (float)((uint)bVar12 * auVar50._8_4_ | (uint)!bVar12 * auVar53._8_4_);
          bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
          fVar69 = (float)((uint)bVar12 * auVar50._12_4_ | (uint)!bVar12 * auVar53._12_4_);
          bVar12 = (bool)((byte)(uVar29 >> 4) & 1);
          fVar70 = (float)((uint)bVar12 * auVar50._16_4_ | (uint)!bVar12 * auVar53._16_4_);
          bVar12 = (bool)((byte)(uVar29 >> 5) & 1);
          fVar71 = (float)((uint)bVar12 * auVar50._20_4_ | (uint)!bVar12 * auVar53._20_4_);
          bVar12 = (bool)((byte)(uVar29 >> 6) & 1);
          fVar72 = (float)((uint)bVar12 * auVar50._24_4_ | (uint)!bVar12 * auVar53._24_4_);
          bVar12 = SUB81(uVar29 >> 7,0);
          auVar20._4_4_ = fVar80 * fVar67;
          auVar20._0_4_ = fVar80 * fVar38;
          auVar20._8_4_ = fVar80 * fVar68;
          auVar20._12_4_ = fVar80 * fVar69;
          auVar20._16_4_ = fVar80 * fVar70;
          auVar20._20_4_ = fVar80 * fVar71;
          auVar20._24_4_ = fVar80 * fVar72;
          auVar20._28_4_ = fVar80;
          auVar3 = vfmadd213ps_fma(auVar85,auVar66,auVar20);
          auVar3 = vfmadd213ps_fma(auVar78,auVar65,ZEXT1632(auVar3));
          auVar44 = ZEXT1632(CONCAT412(auVar3._12_4_ + auVar3._12_4_,
                                       CONCAT48(auVar3._8_4_ + auVar3._8_4_,
                                                CONCAT44(auVar3._4_4_ + auVar3._4_4_,
                                                         auVar3._0_4_ + auVar3._0_4_))));
          auVar86._0_4_ = auVar46._0_4_ * fVar38;
          auVar86._4_4_ = auVar46._4_4_ * fVar67;
          auVar86._8_4_ = auVar46._8_4_ * fVar68;
          auVar86._12_4_ = auVar46._12_4_ * fVar69;
          auVar86._16_4_ = auVar46._16_4_ * fVar70;
          auVar86._20_4_ = auVar46._20_4_ * fVar71;
          auVar86._24_4_ = auVar46._24_4_ * fVar72;
          auVar86._28_4_ = 0;
          auVar3 = vfmadd213ps_fma(auVar42,auVar66,auVar86);
          auVar39 = vfmadd213ps_fma(auVar41,auVar65,ZEXT1632(auVar3));
          auVar42 = vrcp14ps_avx512vl(auVar44);
          auVar41._8_4_ = 0x3f800000;
          auVar41._0_8_ = 0x3f8000003f800000;
          auVar41._12_4_ = 0x3f800000;
          auVar41._16_4_ = 0x3f800000;
          auVar41._20_4_ = 0x3f800000;
          auVar41._24_4_ = 0x3f800000;
          auVar41._28_4_ = 0x3f800000;
          auVar41 = vfnmadd213ps_avx512vl(auVar42,auVar44,auVar41);
          auVar3 = vfmadd132ps_fma(auVar41,auVar42,auVar42);
          uVar2 = *(undefined4 *)(local_1678 + local_1680 * 4 + 0x80);
          local_1580._4_4_ = uVar2;
          local_1580._0_4_ = uVar2;
          local_1580._8_4_ = uVar2;
          local_1580._12_4_ = uVar2;
          local_1580._16_4_ = uVar2;
          local_1580._20_4_ = uVar2;
          local_1580._24_4_ = uVar2;
          local_1580._28_4_ = uVar2;
          auVar100 = ZEXT3264(local_1580);
          local_1280 = ZEXT1632(CONCAT412(auVar3._12_4_ * (auVar39._12_4_ + auVar39._12_4_),
                                          CONCAT48(auVar3._8_4_ * (auVar39._8_4_ + auVar39._8_4_),
                                                   CONCAT44(auVar3._4_4_ *
                                                            (auVar39._4_4_ + auVar39._4_4_),
                                                            auVar3._0_4_ *
                                                            (auVar39._0_4_ + auVar39._0_4_)))));
          uVar15 = vcmpps_avx512vl(local_1280,local_1580,2);
          uVar2 = *(undefined4 *)(local_1678 + local_1680 * 4 + 0x30);
          auVar18._4_4_ = uVar2;
          auVar18._0_4_ = uVar2;
          auVar18._8_4_ = uVar2;
          auVar18._12_4_ = uVar2;
          auVar18._16_4_ = uVar2;
          auVar18._20_4_ = uVar2;
          auVar18._24_4_ = uVar2;
          auVar18._28_4_ = uVar2;
          uVar16 = vcmpps_avx512vl(local_1280,auVar18,0xd);
          bVar17 = (byte)uVar15 & (byte)uVar16 & bVar17;
          if (bVar17 != 0) {
            local_1670 = vcmpps_avx512vl(auVar44,_DAT_01f7b000,4);
            local_1670 = bVar17 & local_1670;
            local_12d8 = (char)local_1670;
            if (local_12d8 != '\0') {
              local_12e0 = &local_1689;
              auVar41 = vsubps_avx(local_1300,auVar62);
              local_1340 = vblendps_avx(auVar61,auVar41,0xf0);
              auVar41 = vsubps_avx(local_1300,auVar61);
              local_1320 = vblendps_avx(auVar62,auVar41,0xf0);
              local_1260[0] = auVar65._0_4_ * 1.0;
              local_1260[1] = auVar65._4_4_ * 1.0;
              local_1260[2] = auVar65._8_4_ * 1.0;
              local_1260[3] = auVar65._12_4_ * 1.0;
              fStack_1250 = auVar65._16_4_ * -1.0;
              fStack_124c = auVar65._20_4_ * -1.0;
              fStack_1248 = auVar65._24_4_ * -1.0;
              uStack_1244 = auVar65._28_4_;
              local_1240[0] = auVar66._0_4_ * 1.0;
              local_1240[1] = auVar66._4_4_ * 1.0;
              local_1240[2] = auVar66._8_4_ * 1.0;
              local_1240[3] = auVar66._12_4_ * 1.0;
              fStack_1230 = auVar66._16_4_ * -1.0;
              fStack_122c = auVar66._20_4_ * -1.0;
              fStack_1228 = auVar66._24_4_ * -1.0;
              uStack_1224 = auVar66._28_4_;
              local_1220[0] = fVar38 * 1.0;
              local_1220[1] = fVar67 * 1.0;
              local_1220[2] = fVar68 * 1.0;
              local_1220[3] = fVar69 * 1.0;
              fStack_1210 = fVar70 * -1.0;
              fStack_120c = fVar71 * -1.0;
              fStack_1208 = fVar72 * -1.0;
              uStack_1204 = (uint)bVar12 * auVar50._28_4_ | (uint)!bVar12 * auVar53._28_4_;
              pGVar31 = (context->scene->geometries).items[*(uint *)(local_15f8 + 0x88)].ptr;
              if ((pGVar31->mask & *(uint *)(local_1678 + local_1680 * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar31->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01dd0d01:
                  *(undefined4 *)(local_1678 + local_1680 * 4 + 0x80) = 0xff800000;
                  goto LAB_01dd0d26;
                }
                auVar41 = vpbroadcastd_avx512vl();
                auVar41 = vpaddd_avx2(auVar41,_DAT_01fb7740);
                auVar42 = vpbroadcastd_avx512vl();
                auVar42 = vpaddd_avx2(auVar42,_DAT_01fb7760);
                auVar76._0_4_ = (float)(int)(*(ushort *)(lVar10 + 8 + lVar34) - 1);
                auVar76._4_12_ = auVar61._4_12_;
                auVar13._12_4_ = 0;
                auVar13._0_12_ = ZEXT812(0);
                auVar39 = vrcp14ss_avx512f(auVar13 << 0x20,ZEXT416((uint)auVar76._0_4_));
                auVar3 = vfnmadd213ss_fma(auVar76,auVar39,SUB6416(ZEXT464(0x40000000),0));
                fVar72 = auVar39._0_4_ * auVar3._0_4_;
                auVar79._0_4_ = (float)(int)(*(ushort *)(lVar10 + 10 + lVar34) - 1);
                auVar79._4_12_ = auVar61._4_12_;
                auVar39 = vrcp14ss_avx512f(auVar13 << 0x20,ZEXT416((uint)auVar79._0_4_));
                auVar3 = vfnmadd213ss_fma(auVar79,auVar39,SUB6416(ZEXT464(0x40000000),0));
                fVar84 = auVar39._0_4_ * auVar3._0_4_;
                auVar41 = vcvtdq2ps_avx(auVar41);
                auVar42 = vcvtdq2ps_avx(auVar42);
                auVar19._8_4_ = 0x219392ef;
                auVar19._0_8_ = 0x219392ef219392ef;
                auVar19._12_4_ = 0x219392ef;
                auVar19._16_4_ = 0x219392ef;
                auVar19._20_4_ = 0x219392ef;
                auVar19._24_4_ = 0x219392ef;
                auVar19._28_4_ = 0x219392ef;
                uVar32 = vcmpps_avx512vl(local_1300,auVar19,5);
                auVar44 = vrcp14ps_avx512vl(local_1300);
                auVar77._8_4_ = 0x3f800000;
                auVar77._0_8_ = 0x3f8000003f800000;
                auVar77._12_4_ = 0x3f800000;
                auVar77._16_4_ = 0x3f800000;
                auVar77._20_4_ = 0x3f800000;
                auVar77._24_4_ = 0x3f800000;
                auVar77._28_4_ = 0x3f800000;
                auVar3 = vfnmadd213ps_fma(local_1300,auVar44,auVar77);
                auVar45 = vfmadd132ps_avx512vl(ZEXT1632(auVar3),auVar44,auVar44);
                fVar80 = (float)((uint)((byte)uVar32 & 1) * auVar45._0_4_);
                fVar38 = (float)((uint)((byte)(uVar32 >> 1) & 1) * auVar45._4_4_);
                fVar67 = (float)((uint)((byte)(uVar32 >> 2) & 1) * auVar45._8_4_);
                fVar68 = (float)((uint)((byte)(uVar32 >> 3) & 1) * auVar45._12_4_);
                fVar69 = (float)((uint)((byte)(uVar32 >> 4) & 1) * auVar45._16_4_);
                fVar70 = (float)((uint)((byte)(uVar32 >> 5) & 1) * auVar45._20_4_);
                fVar71 = (float)((uint)((byte)(uVar32 >> 6) & 1) * auVar45._24_4_);
                auVar21._4_4_ =
                     (local_1300._4_4_ * auVar41._4_4_ + local_1340._4_4_) * fVar72 * fVar38;
                auVar21._0_4_ =
                     (local_1300._0_4_ * auVar41._0_4_ + local_1340._0_4_) * fVar72 * fVar80;
                auVar21._8_4_ =
                     (local_1300._8_4_ * auVar41._8_4_ + local_1340._8_4_) * fVar72 * fVar67;
                auVar21._12_4_ =
                     (local_1300._12_4_ * auVar41._12_4_ + local_1340._12_4_) * fVar72 * fVar68;
                auVar21._16_4_ =
                     (local_1300._16_4_ * auVar41._16_4_ + local_1340._16_4_) * fVar72 * fVar69;
                auVar21._20_4_ =
                     (local_1300._20_4_ * auVar41._20_4_ + local_1340._20_4_) * fVar72 * fVar70;
                auVar21._24_4_ =
                     (local_1300._24_4_ * auVar41._24_4_ + local_1340._24_4_) * fVar72 * fVar71;
                auVar21._28_4_ = auVar44._28_4_;
                local_12c0 = vminps_avx(auVar21,auVar77);
                auVar22._4_4_ =
                     (local_1300._4_4_ * auVar42._4_4_ + local_1320._4_4_) * fVar84 * fVar38;
                auVar22._0_4_ =
                     (local_1300._0_4_ * auVar42._0_4_ + local_1320._0_4_) * fVar84 * fVar80;
                auVar22._8_4_ =
                     (local_1300._8_4_ * auVar42._8_4_ + local_1320._8_4_) * fVar84 * fVar67;
                auVar22._12_4_ =
                     (local_1300._12_4_ * auVar42._12_4_ + local_1320._12_4_) * fVar84 * fVar68;
                auVar22._16_4_ =
                     (local_1300._16_4_ * auVar42._16_4_ + local_1320._16_4_) * fVar84 * fVar69;
                auVar22._20_4_ =
                     (local_1300._20_4_ * auVar42._20_4_ + local_1320._20_4_) * fVar84 * fVar70;
                auVar22._24_4_ =
                     (local_1300._24_4_ * auVar42._24_4_ + local_1320._24_4_) * fVar84 * fVar71;
                auVar22._28_4_ = (uint)(byte)(uVar32 >> 7) * auVar45._28_4_;
                local_12a0 = vminps_avx(auVar22,auVar77);
                local_1660 = 0;
                for (uVar32 = local_1670; (uVar32 & 1) == 0;
                    uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                  local_1660 = local_1660 + 1;
                }
                local_1640 = vpbroadcastd_avx512vl();
                local_1650 = vpbroadcastd_avx512vl();
                local_14a0 = auVar107._0_32_;
                local_14c0 = auVar108._0_32_;
                local_14e0 = auVar109._0_32_;
                local_1500 = auVar110._0_32_;
                local_1520 = auVar111._0_32_;
                local_1540 = auVar112._0_32_;
                local_1668 = pGVar31;
                while (local_1670 != 0) {
                  local_1440 = *(undefined4 *)(local_12c0 + local_1660 * 4);
                  local_1430 = *(undefined4 *)(local_12a0 + local_1660 * 4);
                  *(float *)(local_1678 + local_1680 * 4 + 0x80) = local_1260[local_1660 - 8];
                  local_15b0.context = context->user;
                  local_1470 = local_1260[local_1660];
                  local_1460 = local_1240[local_1660];
                  local_1450 = local_1220[local_1660];
                  local_1420 = local_1650._0_8_;
                  uStack_1418 = local_1650._8_8_;
                  local_1410 = local_1640;
                  vpcmpeqd_avx2(ZEXT1632(local_1640),ZEXT1632(local_1640));
                  uStack_13fc = (local_15b0.context)->instID[0];
                  local_1400 = uStack_13fc;
                  uStack_13f8 = uStack_13fc;
                  uStack_13f4 = uStack_13fc;
                  uStack_13f0 = (local_15b0.context)->instPrimID[0];
                  uStack_13ec = uStack_13f0;
                  uStack_13e8 = uStack_13f0;
                  uStack_13e4 = uStack_13f0;
                  local_1630 = local_1550;
                  local_15b0.valid = (int *)local_1630;
                  local_15b0.geometryUserPtr = pGVar31->userPtr;
                  local_15b0.ray = (RTCRayN *)local_1678;
                  local_15b0.hit = (RTCHitN *)&local_1470;
                  local_15b0.N = 4;
                  fStack_146c = local_1470;
                  fStack_1468 = local_1470;
                  fStack_1464 = local_1470;
                  fStack_145c = local_1460;
                  fStack_1458 = local_1460;
                  fStack_1454 = local_1460;
                  fStack_144c = local_1450;
                  fStack_1448 = local_1450;
                  fStack_1444 = local_1450;
                  uStack_143c = local_1440;
                  uStack_1438 = local_1440;
                  uStack_1434 = local_1440;
                  uStack_142c = local_1430;
                  uStack_1428 = local_1430;
                  uStack_1424 = local_1430;
                  if (pGVar31->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar31->occlusionFilterN)(&local_15b0);
                    auVar100 = ZEXT3264(local_1580);
                    auVar112 = ZEXT3264(local_1540);
                    auVar111 = ZEXT3264(local_1520);
                    auVar110 = ZEXT3264(local_1500);
                    auVar109 = ZEXT3264(local_14e0);
                    auVar108 = ZEXT3264(local_14c0);
                    auVar107 = ZEXT3264(local_14a0);
                    pGVar31 = local_1668;
                  }
                  uVar32 = vptestmd_avx512vl(local_1630,local_1630);
                  if ((uVar32 & 0xf) != 0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar31->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_15b0);
                      auVar100 = ZEXT3264(local_1580);
                      auVar112 = ZEXT3264(local_1540);
                      auVar111 = ZEXT3264(local_1520);
                      auVar110 = ZEXT3264(local_1500);
                      auVar109 = ZEXT3264(local_14e0);
                      auVar108 = ZEXT3264(local_14c0);
                      auVar107 = ZEXT3264(local_14a0);
                      pGVar31 = local_1668;
                    }
                    auVar3 = *(undefined1 (*) [16])(local_15b0.ray + 0x80);
                    uVar32 = vptestmd_avx512vl(local_1630,local_1630);
                    uVar32 = uVar32 & 0xf;
                    auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar12 = (bool)((byte)uVar32 & 1);
                    auVar40._0_4_ = (uint)bVar12 * auVar39._0_4_ | (uint)!bVar12 * auVar3._0_4_;
                    bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
                    auVar40._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar3._4_4_;
                    bVar12 = (bool)((byte)(uVar32 >> 2) & 1);
                    auVar40._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar3._8_4_;
                    bVar12 = SUB81(uVar32 >> 3,0);
                    auVar40._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar3._12_4_;
                    *(undefined1 (*) [16])(local_15b0.ray + 0x80) = auVar40;
                    if ((byte)uVar32 != 0) goto LAB_01dd0d01;
                  }
                  *(int *)(local_1678 + local_1680 * 4 + 0x80) = auVar100._0_4_;
                  uVar32 = local_1660 & 0x3f;
                  local_1660 = 0;
                  local_1670 = local_1670 ^ 1L << uVar32;
                  for (uVar32 = local_1670; (uVar32 & 1) == 0;
                      uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                    local_1660 = local_1660 + 1;
                  }
                }
              }
            }
          }
        }
        auVar100 = ZEXT3264(local_13c0);
        auVar103 = ZEXT3264(local_13e0);
        uVar32 = local_1600;
        uVar33 = local_1608;
        fVar80 = local_1360;
        fVar68 = fStack_135c;
        fVar69 = fStack_1358;
        fVar70 = fStack_1354;
        fVar71 = fStack_1350;
        fVar72 = fStack_134c;
        fVar84 = fStack_1348;
        fVar38 = local_1380;
        fVar87 = fStack_137c;
        fVar88 = fStack_1378;
        fVar89 = fStack_1374;
        fVar90 = fStack_1370;
        fVar91 = fStack_136c;
        fVar92 = fStack_1368;
        fVar67 = local_13a0;
        fVar93 = fStack_139c;
        fVar94 = fStack_1398;
        fVar95 = fStack_1394;
        fVar96 = fStack_1390;
        fVar97 = fStack_138c;
        fVar98 = fStack_1388;
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }